

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O2

void __GOMP_taskloop<long>
               (_func_void_void_ptr *func,void *data,_func_void_void_ptr_void_ptr *copy_func,
               long arg_size,long arg_align,uint gomp_flags,unsigned_long num_tasks,int priority,
               long start,long end,long step)

{
  kmp_uint64 *lb;
  int gtid;
  int sched;
  kmp_task_t *task;
  byte bVar1;
  ulong uVar2;
  void *__dest;
  code *task_dup;
  kmp_tasking_flags_t local_34;
  
  gtid = __kmp_get_global_thread_id_reg();
  if ((ulong)arg_size < 0x10) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_gsupport.cpp"
                       ,0x708);
  }
  if (arg_align < 1) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_gsupport.cpp"
                       ,0x709);
  }
  if (0 < step && (gomp_flags & 0x100) == 0) {
    uVar2 = 0x3f;
    for (; (-1 < (int)uVar2 && (bVar1 = (byte)uVar2, ((ulong)step >> (uVar2 & 0x3f) & 1) == 0));
        step = step | 1L << (bVar1 & 0x3f)) {
      uVar2 = (ulong)((int)uVar2 - 1);
    }
  }
  local_34 = (kmp_tasking_flags_t)(gomp_flags & 3 ^ 0x1000001);
  sched = 2 - (uint)((gomp_flags >> 9 & 1) != 0);
  if (num_tasks == 0) {
    sched = 0;
  }
  task = __kmp_task_alloc(&__GOMP_taskloop<long>::loc,gtid,&local_34,0x28,(arg_align + arg_size) - 1
                          ,(kmp_routine_entry_t)func);
  task[-4].data1.destructors = (kmp_routine_entry_t)copy_func;
  *(undefined4 *)((long)&task[-4].routine + 4) = 8;
  uVar2 = (long)task->shareds + arg_align + -1;
  __dest = (void *)(uVar2 - uVar2 % (ulong)arg_align);
  task->shareds = __dest;
  task_dup = __kmp_gomp_task_dup;
  if (copy_func == (_func_void_void_ptr_void_ptr *)0x0) {
    task_dup = (code *)0x0;
  }
  memcpy(__dest,data,arg_size);
  lb = (kmp_uint64 *)task->shareds;
  *lb = start;
  lb[1] = (-(ulong)((gomp_flags >> 8 & 1) != 0) | 1) + end;
  __kmpc_taskloop(&__GOMP_taskloop<long>::loc,gtid,task,gomp_flags & 0x400,lb,lb + 1,step,
                  gomp_flags & 0x800,sched,num_tasks,task_dup);
  return;
}

Assistant:

void __GOMP_taskloop(void (*func)(void *), void *data,
                     void (*copy_func)(void *, void *), long arg_size,
                     long arg_align, unsigned gomp_flags,
                     unsigned long num_tasks, int priority, T start, T end,
                     T step) {
  typedef void (*p_task_dup_t)(kmp_task_t *, kmp_task_t *, kmp_int32);
  MKLOC(loc, "GOMP_taskloop");
  int sched;
  T *loop_bounds;
  int gtid = __kmp_entry_gtid();
  kmp_int32 flags = 0;
  int if_val = gomp_flags & (1u << 10);
  int nogroup = gomp_flags & (1u << 11);
  int up = gomp_flags & (1u << 8);
  p_task_dup_t task_dup = NULL;
  kmp_tasking_flags_t *input_flags = (kmp_tasking_flags_t *)&flags;
#ifdef KMP_DEBUG
  {
    char *buff;
    buff = __kmp_str_format(
        "GOMP_taskloop: T#%%d: func:%%p data:%%p copy_func:%%p "
        "arg_size:%%ld arg_align:%%ld gomp_flags:0x%%x num_tasks:%%lu "
        "priority:%%d start:%%%s end:%%%s step:%%%s\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KA_TRACE(20, (buff, gtid, func, data, copy_func, arg_size, arg_align,
                  gomp_flags, num_tasks, priority, start, end, step));
    __kmp_str_free(&buff);
  }
#endif
  KMP_ASSERT((size_t)arg_size >= 2 * sizeof(T));
  KMP_ASSERT(arg_align > 0);
  // The low-order bit is the "untied" flag
  if (!(gomp_flags & 1)) {
    input_flags->tiedness = 1;
  }
  // The second low-order bit is the "final" flag
  if (gomp_flags & 2) {
    input_flags->final = 1;
  }
  // Negative step flag
  if (!up) {
    // If step is flagged as negative, but isn't properly sign extended
    // Then manually sign extend it.  Could be a short, int, char embedded
    // in a long.  So cannot assume any cast.
    if (step > 0) {
      for (int i = sizeof(T) * CHAR_BIT - 1; i >= 0L; --i) {
        // break at the first 1 bit
        if (step & ((T)1 << i))
          break;
        step |= ((T)1 << i);
      }
    }
  }
  input_flags->native = 1;
  // Figure out if none/grainsize/num_tasks clause specified
  if (num_tasks > 0) {
    if (gomp_flags & (1u << 9))
      sched = 1; // grainsize specified
    else
      sched = 2; // num_tasks specified
    // neither grainsize nor num_tasks specified
  } else {
    sched = 0;
  }

  // __kmp_task_alloc() sets up all other flags
  kmp_task_t *task =
      __kmp_task_alloc(&loc, gtid, input_flags, sizeof(kmp_task_t),
                       arg_size + arg_align - 1, (kmp_routine_entry_t)func);
  kmp_taskdata_t *taskdata = KMP_TASK_TO_TASKDATA(task);
  taskdata->td_copy_func = copy_func;
  taskdata->td_size_loop_bounds = sizeof(T);

  // re-align shareds if needed and setup firstprivate copy constructors
  // through the task_dup mechanism
  task->shareds = (void *)((((size_t)task->shareds) + arg_align - 1) /
                           arg_align * arg_align);
  if (copy_func) {
    task_dup = __kmp_gomp_task_dup;
  }
  KMP_MEMCPY(task->shareds, data, arg_size);

  loop_bounds = (T *)task->shareds;
  loop_bounds[0] = start;
  loop_bounds[1] = end + (up ? -1 : 1);
  __kmpc_taskloop(&loc, gtid, task, if_val, (kmp_uint64 *)&(loop_bounds[0]),
                  (kmp_uint64 *)&(loop_bounds[1]), (kmp_int64)step, nogroup,
                  sched, (kmp_uint64)num_tasks, (void *)task_dup);
}